

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint uVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  byte bVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  
  pUVar2 = ms->hashTable;
  uVar1 = (ms->cParams).hashLog;
  uVar6 = (ms->cParams).chainLog;
  pUVar3 = ms->chainTable;
  pBVar4 = (ms->window).base;
  bVar5 = 0x40 - (char)uVar1;
  bVar7 = 0x20 - (char)uVar1;
  iVar9 = (ms->cParams).minMatch - 5;
  lVar10 = -0x30e4432345000000;
  for (uVar8 = (ulong)ms->nextToUpdate; uVar8 < ((long)ip - (long)pBVar4 & 0xffffffffU);
      uVar8 = uVar8 + 1) {
    if (0x20 < uVar1) goto LAB_001beac4;
    switch(iVar9) {
    case 0:
      uVar11 = *(long *)(pBVar4 + uVar8) * -0x30e4432345000000;
      break;
    case 1:
      uVar11 = *(long *)(pBVar4 + uVar8) * -0x30e4432340650000;
      break;
    case 2:
      uVar11 = *(long *)(pBVar4 + uVar8) * -0x30e44323405a9d00;
      break;
    case 3:
      uVar11 = *(long *)(pBVar4 + uVar8) * -0x30e44323485a9b9d;
      break;
    default:
      uVar11 = (ulong)((uint)(*(int *)(pBVar4 + uVar8) * -0x61c8864f) >> (bVar7 & 0x1f));
      goto LAB_001bea1e;
    }
    uVar11 = uVar11 >> (bVar5 & 0x3f);
LAB_001bea1e:
    pUVar3[(uint)uVar8 & ~(-1 << ((byte)uVar6 & 0x1f))] = pUVar2[uVar11];
    pUVar2[uVar11] = (uint)uVar8;
  }
  ms->nextToUpdate = (U32)((long)ip - (long)pBVar4);
  if (0x20 < uVar1) {
LAB_001beac4:
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(iVar9) {
  case 0:
    break;
  case 1:
    lVar10 = -0x30e4432340650000;
    break;
  case 2:
    lVar10 = -0x30e44323405a9d00;
    break;
  case 3:
    lVar10 = -0x30e44323485a9b9d;
    break;
  default:
    uVar8 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (bVar7 & 0x1f));
    goto LAB_001bea9f;
  }
  uVar8 = (ulong)(lVar10 * *(long *)ip) >> (bVar5 & 0x3f);
LAB_001bea9f:
  return pUVar2[uVar8];
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}